

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

void tcu::astc::decompress
               (PixelBufferAccess *dst,deUint8 *data,CompressedTexFormat format,AstcMode mode)

{
  uint blockWidth;
  bool isSRGB;
  int iVar1;
  ulong uVar2;
  int j;
  int blockHeight;
  ulong uVar3;
  int iVar4;
  int i;
  int iVar5;
  Vec4 local_950;
  Block128 blockData;
  anon_union_2304_2_1776bc36 decompressedBuffer;
  
  isSRGB = isAstcSRGBFormat(format);
  blockWidth = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
  blockHeight = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  anon_unknown_0::Block128::Block128(&blockData,data);
  anon_unknown_0::decompressBlock
            (&decompressedBuffer,&blockData,blockWidth,blockHeight,isSRGB,
             mode == ASTCMODE_LDR || isSRGB);
  iVar1 = 0;
  uVar2 = 0;
  if (0 < (int)blockWidth) {
    uVar2 = (ulong)blockWidth;
  }
  if (blockHeight < 1) {
    blockHeight = iVar1;
  }
  if (isSRGB) {
    iVar1 = 3;
    for (iVar5 = 0; iVar5 != blockHeight; iVar5 = iVar5 + 1) {
      iVar4 = iVar1;
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        local_950.m_data[0] = (float)(uint)decompressedBuffer.sRGB[iVar4 + -3];
        local_950.m_data[1] = (float)(uint)decompressedBuffer.sRGB[iVar4 + -2];
        local_950.m_data[2] = (float)(uint)decompressedBuffer.sRGB[iVar4 + -1];
        local_950.m_data[3] = (float)(uint)decompressedBuffer.sRGB[iVar4];
        PixelBufferAccess::setPixel(dst,(IVec4 *)&local_950,(int)uVar3,iVar5,0);
        iVar4 = iVar4 + 4;
      }
      iVar1 = iVar1 + blockWidth * 4;
    }
  }
  else {
    iVar5 = 3;
    for (; iVar1 != blockHeight; iVar1 = iVar1 + 1) {
      iVar4 = iVar5;
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        local_950.m_data[0] = *(float *)((long)&decompressedBuffer + (long)(iVar4 + -3) * 4);
        local_950.m_data[1] = *(float *)((long)&decompressedBuffer + (long)(iVar4 + -2) * 4);
        local_950.m_data[2] = *(float *)((long)&decompressedBuffer + (long)(iVar4 + -1) * 4);
        local_950.m_data[3] = *(float *)((long)&decompressedBuffer + (long)iVar4 * 4);
        PixelBufferAccess::setPixel(dst,&local_950,(int)uVar3,iVar1,0);
        iVar4 = iVar4 + 4;
      }
      iVar5 = iVar5 + blockWidth * 4;
    }
  }
  return;
}

Assistant:

void decompress (const PixelBufferAccess& dst, const deUint8* data, CompressedTexFormat format, TexDecompressionParams::AstcMode mode)
{
	const bool			isSRGBFormat	= isAstcSRGBFormat(format);

#if defined(DE_DEBUG)
	const tcu::IVec3	blockPixelSize	= getBlockPixelSize(format);

	DE_ASSERT(dst.getWidth()	== blockPixelSize.x() &&
			  dst.getHeight()	== blockPixelSize.y() &&
			  dst.getDepth()	== blockPixelSize.z());
	DE_ASSERT(mode == TexDecompressionParams::ASTCMODE_LDR || mode == TexDecompressionParams::ASTCMODE_HDR);
#endif

	// sRGB is not supported in HDR mode
	DE_ASSERT(!(mode == TexDecompressionParams::ASTCMODE_HDR && isSRGBFormat));

	decompress(dst, data, isSRGBFormat, isSRGBFormat || mode == TexDecompressionParams::ASTCMODE_LDR);
}